

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O3

int32 gauden_param_read(vector_t ****out_param,int32 *out_n_mgau,int32 *out_n_feat,
                       int32 *out_n_density,int32 **out_veclen,char *file_name)

{
  int iVar1;
  bool bVar2;
  vector_t ****pppppfVar3;
  int32 iVar4;
  int iVar5;
  uint uVar6;
  FILE *pFVar7;
  int32 *buf;
  vector_t ***ppppfVar8;
  vector_t buf_00;
  size_t sVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  vector_t pfVar14;
  char **ppcVar15;
  int32 n_feat;
  int32 byteswap;
  uint32 chksum;
  char *local_88;
  int32 n_density;
  int32 n_mgau;
  int32 n;
  char tmp;
  FILE *local_70;
  char **argval;
  char **argname;
  int32 *local_58;
  int32 **local_50;
  int32 *local_48;
  int32 *local_40;
  vector_t ****local_38;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
          ,0xd5,"Reading mixture gaussian parameter: %s\n",file_name);
  local_88 = file_name;
  pFVar7 = fopen(file_name,"rb");
  if (pFVar7 == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                   ,0xd8,"fopen(%s,rb) failed\n",local_88);
  }
  else {
    local_70 = pFVar7;
    local_38 = out_param;
    iVar4 = bio_readhdr((FILE *)pFVar7,&argname,&argval,&byteswap);
    if (iVar4 < 0) {
      pcVar11 = "bio_readhdr(%s) failed\n";
      lVar12 = 0xdc;
    }
    else {
      pcVar11 = *argname;
      local_48 = out_n_feat;
      local_40 = out_n_mgau;
      if (pcVar11 == (char *)0x0) {
        bVar2 = true;
      }
      else {
        lVar12 = 0;
        bVar2 = false;
        ppcVar15 = argname;
        local_58 = out_n_density;
        local_50 = out_veclen;
        do {
          iVar5 = strcmp(pcVar11,"version");
          if (iVar5 == 0) {
            pcVar11 = *(char **)((long)argval + lVar12);
            iVar5 = strcmp(pcVar11,"1.0");
            if (iVar5 != 0) {
              err_msg(ERR_WARN,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                      ,0xe4,"Version mismatch(%s): %s, expecting %s\n",local_88,pcVar11,"1.0");
              ppcVar15 = argname;
            }
          }
          else {
            iVar5 = strcmp(pcVar11,"chksum0");
            if (iVar5 == 0) {
              bVar2 = true;
            }
          }
          pcVar11 = *(char **)((long)ppcVar15 + lVar12 + 8);
          lVar12 = lVar12 + 8;
        } while (pcVar11 != (char *)0x0);
        bVar2 = !bVar2;
        out_n_density = local_58;
        argname = ppcVar15;
        out_veclen = local_50;
      }
      bio_hdrarg_free(argname,argval);
      pFVar7 = local_70;
      argval = (char **)0x0;
      argname = (char **)0x0;
      chksum = 0;
      iVar4 = bio_fread(&n_mgau,4,1,(FILE *)local_70,byteswap,&chksum);
      if (iVar4 == 1) {
        *local_40 = n_mgau;
        iVar4 = bio_fread(&n_feat,4,1,(FILE *)pFVar7,byteswap,&chksum);
        pppppfVar3 = local_38;
        if (iVar4 == 1) {
          *local_48 = n_feat;
          iVar4 = bio_fread(&n_density,4,1,(FILE *)pFVar7,byteswap,&chksum);
          if (iVar4 == 1) {
            *out_n_density = n_density;
            buf = (int32 *)__ckd_calloc__((long)n_feat,4,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                                          ,0x100);
            *out_veclen = buf;
            uVar6 = bio_fread(buf,4,n_feat,(FILE *)pFVar7,byteswap,&chksum);
            if (uVar6 == n_feat) {
              if ((int)uVar6 < 1) {
                uVar13 = 0;
              }
              else {
                uVar10 = 0;
                uVar13 = 0;
                do {
                  uVar13 = (ulong)(uint)((int)uVar13 + buf[uVar10]);
                  uVar10 = uVar10 + 1;
                } while (uVar6 != uVar10);
              }
              iVar4 = bio_fread(&n,4,1,(FILE *)pFVar7,byteswap,&chksum);
              if (iVar4 == 1) {
                if (n != n_density * n_mgau * (int)uVar13) {
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                          ,0x110,"%s: #float32s(%d) doesn\'t match dimensions: %d x %d x %d\n",
                          local_88,(ulong)(uint)n,(long)n_mgau,(long)n_density,uVar13);
                  goto LAB_00117876;
                }
                ppppfVar8 = *pppppfVar3;
                if (ppppfVar8 == (vector_t ***)0x0) {
                  ppppfVar8 = (vector_t ***)
                              __ckd_calloc_3d__((long)n_mgau,(long)n_feat,(long)n_density,8,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                                                ,0x116);
                  buf_00 = (vector_t)
                           __ckd_calloc__((long)n,4,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                                          ,0x117);
                  if (0 < (long)n_mgau) {
                    lVar12 = 0;
                    iVar5 = 0;
                    do {
                      if (0 < n_feat) {
                        uVar13 = 0;
                        do {
                          if (0 < n_density) {
                            iVar1 = buf[uVar13];
                            pfVar14 = buf_00 + iVar5;
                            iVar5 = iVar5 + iVar1 * n_density;
                            uVar10 = 0;
                            do {
                              ppppfVar8[lVar12][uVar13][uVar10] = pfVar14;
                              uVar10 = uVar10 + 1;
                              pfVar14 = pfVar14 + iVar1;
                            } while ((uint)n_density != uVar10);
                          }
                          uVar13 = uVar13 + 1;
                        } while (uVar13 != (uint)n_feat);
                      }
                      lVar12 = lVar12 + 1;
                    } while (lVar12 != n_mgau);
                  }
                }
                else {
                  buf_00 = ***ppppfVar8;
                }
                iVar4 = bio_fread(buf_00,4,n,(FILE *)local_70,byteswap,&chksum);
                if (iVar4 == n) {
                  if (!bVar2) {
                    bio_verify_chksum((FILE *)local_70,byteswap,chksum);
                  }
                  pFVar7 = local_70;
                  sVar9 = fread(&tmp,1,1,local_70);
                  if (sVar9 != 1) {
                    fclose(pFVar7);
                    *pppppfVar3 = ppppfVar8;
                    err_msg(ERR_INFO,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                            ,0x135,"%d codebook, %d feature, size\n",(ulong)(uint)n_mgau,
                            (ulong)(uint)n_feat);
                    if (0 < n_feat) {
                      lVar12 = 0;
                      do {
                        printf(" %dx%d",(ulong)(uint)n_density,(ulong)(uint)buf[lVar12]);
                        lVar12 = lVar12 + 1;
                      } while (lVar12 < n_feat);
                    }
                    putchar(10);
                    iVar5 = fflush(_stdout);
                    return iVar5;
                  }
                  pcVar11 = "More data than expected in %s\n";
                  lVar12 = 0x12f;
                }
                else {
                  pcVar11 = "fread(%s) (densitydata) failed\n";
                  lVar12 = 0x129;
                }
              }
              else {
                pcVar11 = "fread(%s) (total #floats) failed\n";
                lVar12 = 0x10c;
              }
            }
            else {
              pcVar11 = "fread(%s) (feature-lengths) failed\n";
              lVar12 = 0x104;
            }
          }
          else {
            pcVar11 = "fread(%s) (#density/codebook) failed\n";
            lVar12 = 0xfc;
          }
        }
        else {
          pcVar11 = "fread(%s) (#features) failed\n";
          lVar12 = 0xf6;
        }
      }
      else {
        pcVar11 = "fread(%s) (#codebooks) failed\n";
        lVar12 = 0xf1;
      }
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
            ,lVar12,pcVar11,local_88);
  }
LAB_00117876:
  exit(1);
}

Assistant:

static int32
gauden_param_read(vector_t **** out_param,      /* Alloc space iff *out_param == NULL */
                  int32 * out_n_mgau,
                  int32 * out_n_feat,
                  int32 * out_n_density,
                  int32 ** out_veclen, const char *file_name)
{
    char tmp;
    FILE *fp;
    int32 i, j, k, l, n, blk;
    int32 n_mgau;
    int32 n_feat;
    int32 n_density;
    int32 *veclen;
    int32 byteswap, chksum_present;
    vector_t ***out;
    float32 *buf;
    char **argname, **argval;
    uint32 chksum;

    E_INFO("Reading mixture gaussian parameter: %s\n", file_name);

    if ((fp = fopen(file_name, "rb")) == NULL)
        E_FATAL_SYSTEM("fopen(%s,rb) failed\n", file_name);

    /* Read header, including argument-value info and 32-bit byteorder magic */
    if (bio_readhdr(fp, &argname, &argval, &byteswap) < 0)
        E_FATAL("bio_readhdr(%s) failed\n", file_name);

    /* Parse argument-value list */
    chksum_present = 0;
    for (i = 0; argname[i]; i++) {
        if (strcmp(argname[i], "version") == 0) {
            if (strcmp(argval[i], GAUDEN_PARAM_VERSION) != 0)
                E_WARN("Version mismatch(%s): %s, expecting %s\n",
                       file_name, argval[i], GAUDEN_PARAM_VERSION);
        }
        else if (strcmp(argname[i], "chksum0") == 0) {
            chksum_present = 1; /* Ignore the associated value */
        }
    }
    bio_hdrarg_free(argname, argval);
    argname = argval = NULL;

    chksum = 0;

    /* #Codebooks */
    if (bio_fread(&n_mgau, sizeof(int32), 1, fp, byteswap, &chksum) != 1)
        E_FATAL("fread(%s) (#codebooks) failed\n", file_name);
    *out_n_mgau = n_mgau;

    /* #Features/codebook */
    if (bio_fread(&n_feat, sizeof(int32), 1, fp, byteswap, &chksum) != 1)
        E_FATAL("fread(%s) (#features) failed\n", file_name);
    *out_n_feat = n_feat;

    /* #Gaussian densities/feature in each codebook */
    if (bio_fread(&n_density, sizeof(int32), 1, fp, byteswap, &chksum) !=
        1)
        E_FATAL("fread(%s) (#density/codebook) failed\n", file_name);
    *out_n_density = n_density;

    /* #Dimensions in each feature stream */
    veclen = ckd_calloc(n_feat, sizeof(uint32));
    *out_veclen = veclen;
    if (bio_fread(veclen, sizeof(int32), n_feat, fp, byteswap, &chksum) !=
        n_feat)
        E_FATAL("fread(%s) (feature-lengths) failed\n", file_name);

    /* blk = total vector length of all feature streams */
    for (i = 0, blk = 0; i < n_feat; i++)
        blk += veclen[i];

    /* #Floats to follow; for the ENTIRE SET of CODEBOOKS */
    if (bio_fread(&n, sizeof(int32), 1, fp, byteswap, &chksum) != 1)
        E_FATAL("fread(%s) (total #floats) failed\n", file_name);
    if (n != n_mgau * n_density * blk) {
        E_FATAL
            ("%s: #float32s(%d) doesn't match dimensions: %d x %d x %d\n",
             file_name, n, n_mgau, n_density, blk);
    }

    /* Allocate memory for mixture gaussian densities if not already allocated */
    if (!(*out_param)) {
        out = (vector_t ***) ckd_calloc_3d(n_mgau, n_feat, n_density,
                                           sizeof(vector_t));
        buf = (float32 *) ckd_calloc(n, sizeof(float));
        for (i = 0, l = 0; i < n_mgau; i++) {
            for (j = 0; j < n_feat; j++) {
                for (k = 0; k < n_density; k++) {
                    out[i][j][k] = &buf[l];

                    l += veclen[j];
                }
            }
        }
    }
    else {
        out = *out_param;
        buf = out[0][0][0];
    }

    /* Read mixture gaussian densities data */
    if (bio_fread(buf, sizeof(float32), n, fp, byteswap, &chksum) != n)
        E_FATAL("fread(%s) (densitydata) failed\n", file_name);

    if (chksum_present)
        bio_verify_chksum(fp, byteswap, chksum);

    if (fread(&tmp, 1, 1, fp) == 1)
        E_FATAL("More data than expected in %s\n", file_name);

    fclose(fp);

    *out_param = out;

    E_INFO("%d codebook, %d feature, size\n", n_mgau, n_feat);
    for (i = 0; i < n_feat; i++)
        printf(" %dx%d", n_density, veclen[i]);
    printf("\n");
    fflush(stdout);

    return 0;
}